

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral_enumeration_map.cpp
# Opt level: O3

int main(void)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 uVar3;
  _Hash_node_base *p_Var4;
  byte bVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint64_t shift;
  pointer __s;
  ulong uVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  value_type *__val;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  unsigned_long uVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  pair<kitty::static_truth_table<4U,_true>,_bool> pVar28;
  anon_class_16_2_3a34d4c8 __f;
  static_truth_table<4U,_true> spectral;
  __tuple_element_t<0UL,_tuple<static_truth_table<4U,_true>,_unsigned_int,_vector<unsigned_char,_allocator<unsigned_char>_>_>_>
  f_npn;
  truth_table_map classes;
  ulong local_1b0;
  key_type local_188;
  dynamic_truth_table local_180;
  ulong local_160;
  long local_158;
  undefined8 local_150;
  undefined8 local_148;
  static_truth_table<4U,_true> local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  undefined1 local_110 [16];
  miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> local_100;
  
  __s = (pointer)operator_new(0x2000);
  lVar25 = 0;
  local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x400;
  memset(__s,0,0x2000);
  local_180._num_vars = 0x10;
  do {
    puVar1 = __s + lVar25;
    uVar10 = *(uint *)((long)puVar1 + 4);
    uVar24 = puVar1[1];
    uVar6 = *(uint *)((long)puVar1 + 0xc);
    puVar2 = __s + lVar25;
    *(uint *)puVar2 = (uint)*puVar1 ^ 0xffffffff;
    *(uint *)((long)puVar2 + 4) = uVar10 ^ 0xffffffff;
    *(uint *)(puVar2 + 1) = (uint)uVar24 ^ 0xffffffff;
    *(uint *)((long)puVar2 + 0xc) = uVar6 ^ 0xffffffff;
    lVar25 = lVar25 + 2;
  } while (lVar25 != 0x400);
  local_138._0_8_ = local_110 + 8;
  local_138._8_8_ = 1;
  local_128 = (undefined1  [16])0x0;
  local_118 = 1.0;
  local_110 = (undefined1  [16])0x0;
  uVar19 = 0;
  local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x400;
  do {
    uVar10 = ~(uint)uVar19;
    uVar22 = (ulong)(ushort)uVar10;
    uVar20 = uVar19;
    if (uVar22 < uVar19) {
      uVar20 = uVar22;
    }
    uVar23 = local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar19 >> 6];
    local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar19 >> 6] = uVar23 & ~(1L << (uVar19 & 0x3f));
    uVar21 = (ulong)(uVar10 >> 3 & 0x1ff8);
    uVar11 = *(ulong *)((long)local_180._bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar21);
    uVar18 = (ulong)((uint)((uVar11 >> ((ulong)uVar10 & 0x3f) & 1) != 0) +
                    (uint)((uVar23 >> (uVar19 & 0x3f) & 1) != 0));
    *(ulong *)((long)local_180._bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar21) =
         uVar11 & ~(1L << ((ulong)uVar10 & 0x3f));
    uVar8 = kitty::detail::swaps._56_8_;
    uVar7 = kitty::detail::swaps._48_8_;
    local_148 = kitty::detail::swaps._56_8_;
    uVar11 = kitty::detail::swaps._56_8_ - kitty::detail::swaps._48_8_;
    uVar23 = uVar19;
    if (uVar11 == 0) {
      local_1b0 = 0xffffffff;
    }
    else {
      local_1b0 = 0xffffffff;
      uVar21 = 0;
      do {
        uVar17 = (ulong)*(byte *)(uVar7 + uVar21);
        bVar5 = (byte)(1L << (*(byte *)(uVar7 + uVar21) & 0x3f));
        uVar23 = (uVar23 & *(ulong *)(kitty::detail::permutation_masks + uVar17 * 0x18 + 0x10)) >>
                 (bVar5 & 0x3f) |
                 (*(ulong *)(kitty::detail::permutation_masks + uVar17 * 0x18 + 8) & uVar23) <<
                 (bVar5 & 0x3f) |
                 *(ulong *)(kitty::detail::permutation_masks + uVar17 * 0x18) & uVar23;
        uVar22 = (*(ulong *)(kitty::detail::permutation_masks + uVar17 * 0x18 + 0x10) & uVar22) >>
                 (bVar5 & 0x3f) |
                 (*(ulong *)(kitty::detail::permutation_masks + uVar17 * 0x18 + 8) & uVar22) <<
                 (bVar5 & 0x3f) |
                 *(ulong *)(kitty::detail::permutation_masks + uVar17 * 0x18) & uVar22;
        uVar17 = local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar23 >> 6];
        local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23 >> 6] = uVar17 & ~(1L << (uVar23 & 0x3f));
        uVar18 = (ulong)((int)uVar18 + (uint)((uVar17 >> (uVar23 & 0x3f) & 1) != 0) +
                        (uint)((local_180._bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar22 >> 6] >>
                                (uVar22 & 0x3f) & 1) != 0));
        local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar22 >> 6] =
             local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar22 >> 6] & ~(1L << (uVar22 & 0x3f));
        uVar17 = uVar23;
        if (uVar22 < uVar23) {
          uVar17 = uVar22;
        }
        if (uVar22 < uVar20 || uVar23 < uVar20) {
          local_1b0 = uVar21 & 0xffffffff;
          uVar20 = uVar17;
        }
        uVar21 = uVar21 + 1;
      } while (uVar11 != uVar21);
    }
    uVar9 = kitty::detail::flips._48_8_;
    local_150 = kitty::detail::flips._48_8_;
    lVar25 = kitty::detail::flips._56_8_ - kitty::detail::flips._48_8_;
    uVar24 = uVar18;
    if (lVar25 != 0) {
      local_158 = lVar25 + (ulong)(lVar25 == 0);
      lVar25 = 0;
      do {
        uVar23 = uVar23 >> 1 & 0x2222222222222222 |
                 uVar23 * 2 & 0x4444444444444444 | uVar23 & 0x9999999999999999;
        bVar5 = (byte)(1L << (*(byte *)(uVar9 + lVar25) & 0x3f));
        uVar21 = *(ulong *)(kitty::detail::projections + (ulong)*(byte *)(uVar9 + lVar25) * 8);
        uVar22 = uVar22 >> 1 & 0x2222222222222222 |
                 uVar22 * 2 & 0x4444444444444444 | uVar22 & 0x9999999999999999;
        uVar23 = (uVar23 & uVar21) >> (bVar5 & 0x3f) | uVar23 << (bVar5 & 0x3f) & uVar21;
        uVar22 = (uVar22 & uVar21) >> (bVar5 & 0x3f) | uVar22 << (bVar5 & 0x3f) & uVar21;
        uVar21 = local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar23 >> 6];
        local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar23 >> 6] = uVar21 & ~(1L << (uVar23 & 0x3f));
        uVar10 = (uint)((uVar21 >> (uVar23 & 0x3f) & 1) != 0) + (int)uVar18 +
                 (uint)((local_180._bits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)
        ;
        bVar26 = uVar20 <= uVar23;
        bVar27 = uVar20 <= uVar22;
        uVar21 = uVar23;
        if (uVar22 < uVar23) {
          uVar21 = uVar22;
        }
        if (bVar27 && bVar26) {
          uVar21 = uVar20;
        }
        uVar20 = uVar21;
        local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar22 >> 6] =
             local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar22 >> 6] & ~(1L << (uVar22 & 0x3f));
        if (!bVar27 || !bVar26) {
          local_1b0 = 0xffffffff;
        }
        if (uVar8 != uVar7) {
          uVar21 = 0;
          do {
            uVar18 = (ulong)*(byte *)(uVar7 + uVar21);
            bVar5 = (byte)(1L << (*(byte *)(uVar7 + uVar21) & 0x3f));
            uVar23 = (uVar23 & *(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 0x10))
                     >> (bVar5 & 0x3f) |
                     (*(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 8) & uVar23) <<
                     (bVar5 & 0x3f) |
                     *(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18) & uVar23;
            uVar22 = (*(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 0x10) & uVar22)
                     >> (bVar5 & 0x3f) |
                     (*(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18 + 8) & uVar22) <<
                     (bVar5 & 0x3f) |
                     *(ulong *)(kitty::detail::permutation_masks + uVar18 * 0x18) & uVar22;
            uVar18 = local_180._bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar23 >> 6];
            local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar23 >> 6] =
                 uVar18 & ~(1L << (uVar23 & 0x3f));
            uVar10 = uVar10 + ((uVar18 >> (uVar23 & 0x3f) & 1) != 0) +
                     (uint)((local_180._bits.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar22 >> 6] >>
                             (uVar22 & 0x3f) & 1) != 0);
            uVar18 = uVar23;
            if (uVar22 < uVar23) {
              uVar18 = uVar22;
            }
            local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar22 >> 6] =
                 local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar22 >> 6] & ~(1L << (uVar22 & 0x3f));
            if (uVar22 < uVar20 || uVar23 < uVar20) {
              local_1b0 = uVar21;
              uVar20 = uVar18;
            }
            local_1b0 = local_1b0 & 0xffffffff;
            uVar21 = uVar21 + 1;
          } while (uVar11 + (uVar11 == 0) != uVar21);
        }
        lVar25 = lVar25 + 1;
        uVar18 = (ulong)uVar10;
        uVar24 = (unsigned_long)uVar10;
      } while (lVar25 != local_158);
    }
    local_160 = uVar19;
    puVar12 = (undefined4 *)operator_new(4);
    *puVar12 = 0x3020100;
    uVar7 = kitty::detail::swaps._48_8_;
    if (-1 < (int)local_1b0) {
      uVar19 = 0;
      do {
        uVar22 = (ulong)*(byte *)(uVar7 + uVar19);
        uVar3 = *(undefined1 *)((long)puVar12 + uVar22);
        *(undefined1 *)((long)puVar12 + uVar22) = *(undefined1 *)((long)puVar12 + uVar22 + 1);
        *(undefined1 *)((long)puVar12 + uVar22 + 1) = uVar3;
        uVar19 = uVar19 + 1;
      } while ((int)local_1b0 + 1 != uVar19);
    }
    puVar13 = (undefined4 *)operator_new(4);
    *puVar13 = *puVar12;
    operator_delete(puVar12,4);
    local_140._bits = uVar20;
    operator_delete(puVar13,4);
    kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
    miller_spectral_canonization_impl(&local_100,&local_140,true,true,true);
    pVar28 = kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>>::
             run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
                       ((miller_spectral_canonization_impl<kitty::static_truth_table<4u,true>> *)
                        &local_100,kitty::detail::exact_spectral_canonization_null_callback);
    uVar19 = local_160;
    kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::
    ~miller_spectral_canonization_impl(&local_100);
    local_188._bits = pVar28.first._bits._bits;
    iVar14 = std::
             _Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_138,&local_188);
    if (iVar14.
        super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pmVar15 = std::__detail::
                _Map_base<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_138,&local_188);
      pmVar15->first = 1;
      pmVar15->second = uVar24;
    }
    else {
      *(long *)((long)iVar14.
                      super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                      ._M_cur + 0x10) =
           *(long *)((long)iVar14.
                           super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                           ._M_cur + 0x10) + 1;
      *(unsigned_long *)
       ((long)iVar14.
              super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
              ._M_cur + 0x18) =
           uVar24 + *(long *)((long)iVar14.
                                    super__Node_iterator_base<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                                    ._M_cur + 0x18);
    }
    uVar19 = kitty::find_first_one_bit<kitty::dynamic_truth_table>(&local_180,uVar19);
  } while (uVar19 != 0xffffffffffffffff);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[i] enumerated ",0xf);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," functions into ",0x10);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," classes.",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[i] detailed classes:",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  for (p_Var4 = (_Hash_node_base *)local_128._0_8_; p_Var4 != (_Hash_node_base *)0x0;
      p_Var4 = p_Var4->_M_nxt) {
    __f.chunk_size = 4;
    __f.os = (ostream *)&std::cout;
    std::
    for_each<unsigned_long_const*,kitty::print_hex<kitty::static_truth_table<4u,true>,void>(kitty::static_truth_table<4u,true>const&,std::ostream&)::_lambda(auto:1)_1_>
              ((unsigned_long *)(p_Var4 + 1),(unsigned_long *)(p_Var4 + 2),__f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
    kitty::print_spectrum<kitty::static_truth_table<4u,true>>
              ((static_truth_table<4U,_true> *)(p_Var4 + 1),(ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    *(undefined8 *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) = 8;
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    *(undefined8 *)(poVar16 + *(long *)(*(long *)poVar16 + -0x18) + 0x10) = 8;
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
  }
  std::
  _Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<kitty::static_truth_table<4U,_true>,_std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_kitty::static_truth_table<4U,_true>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<kitty::static_truth_table<4U,_true>_>,_kitty::hash<kitty::static_truth_table<4U,_true>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_138);
  if (local_180._bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180._bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_180._bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_180._bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
  static_assert( num_vars <= 5, "number of variables is limited to 5" );

  /* set to store all visited functions during NPN canonization (dynamic to store bits on heap) */
  kitty::dynamic_truth_table map( truth_table::NumBits );

  /* invert bits: 1 means not classified yet */
  std::transform( map.cbegin(), map.cend(), map.begin(), []( auto word ) { return ~word; } );

  /* set to store all NPN and spectral representatives */
  using truth_table_map = std::unordered_map<truth_table, std::pair<uint64_t, uint64_t>, kitty::hash<truth_table>>;
  truth_table_map classes;

  /* start from 0 */
  int64_t index = 0;
  truth_table tt;

  /* for counting the classes and functions */
  //uint64_t ones = map.num_bits();

  auto ctr = 0, bctr = 0;

  while ( index != -1 )
  {
    /* create truth table from index value */
    kitty::create_from_words( tt, &index, &index + 1 );

    /* apply NPN canonization and add resulting representative to set;
       also cross out all the visited functions */
    auto func_count = 0u;
    const auto f_npn = std::get<0>( kitty::exact_npn_canonization( tt,
                                                                   [&map, &func_count]( const auto& tt ) {
                                                                     func_count += kitty::get_bit( map, *tt.cbegin() );
                                                                     kitty::clear_bit( map, *tt.cbegin() ); } ) );

    //auto new_ones = count_ones( map );
    //auto func_count = ones - new_ones;
    //ones = new_ones;

    const auto spectral = kitty::exact_spectral_canonization( f_npn );

    auto it = classes.find( spectral );

    if ( it == classes.end() )
    {
      classes[spectral] = {1u, func_count};
    }
    else
    {
      it->second.first++;
      it->second.second += func_count;
    }

    if ( progress )
    {
      std::cout << ".";

      if ( ++ctr == 100 )
      {
        std::cout << " " << ++bctr << std::endl;
        ctr = 0;
      }
    }

    /* find next non-classified truth table */
    index = find_first_one_bit( map, index );
  }

  if ( progress )
  {
    std::cout << std::endl;
  }

  std::cout << "[i] enumerated "
            << map.num_bits() << " functions into "
            << classes.size() << " classes." << std::endl;

  std::cout << "[i] detailed classes:" << std::endl;

  for ( const auto& p : classes )
  {
    print_hex( p.first );
    std::cout << "   ";
    print_spectrum( p.first );
    std::cout << " " << std::setw( 8 ) << p.second.first << " " << std::setw( 8 ) << p.second.second << std::endl;
  }

  return 0;
}